

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQHash sq_gethash(HSQUIRRELVM v,SQInteger idx)

{
  SQObjectPtr *key;
  SQHash SVar1;
  HSQUIRRELVM in_RSI;
  SQObjectPtr *o;
  SQInteger in_stack_ffffffffffffffe8;
  
  key = stack_get(in_RSI,in_stack_ffffffffffffffe8);
  SVar1 = HashObj(key);
  return SVar1;
}

Assistant:

SQHash sq_gethash(HSQUIRRELVM v, SQInteger idx)
{
    SQObjectPtr &o = stack_get(v, idx);
    return HashObj(o);
}